

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetUserVar
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DObject *self_00;
  bool bVar1;
  bool local_4f;
  FName local_4c;
  PField *local_48;
  PField *var;
  int value;
  FName varname;
  DObject *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1302,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1302,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  _value = (DObject *)(param->field_0).field_1.a;
  local_4f = true;
  if (_value != (DObject *)0x0) {
    local_4f = DObject::IsKindOf(_value,DObject::RegistrationInfo.MyClass);
  }
  if (local_4f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1302,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1303,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1303,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  FName::FName((FName *)((long)&var + 4),param[1].field_0.i);
  self_00 = _value;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1304,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1304,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  var._0_4_ = param[2].field_0.i;
  FName::FName(&local_4c,(FName *)((long)&var + 4));
  local_48 = GetVar(self_00,&local_4c);
  if (local_48 != (PField *)0x0) {
    (*(local_48->Type->super_PTypeBase).super_DObject._vptr_DObject[0xf])
              (local_48->Type,(long)&_value->_vptr_DObject + local_48->Offset,(ulong)(uint)var);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserVar)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_INT	(value);

	// Set the value of the specified user variable.
	PField *var = GetVar(self, varname);
	if (var != nullptr)
	{
		var->Type->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset, value);
	}
	return 0;
}